

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::localize_global_variables(CompilerMSL *this)

{
  uint uVar1;
  bool bVar2;
  SPIRFunction *pSVar3;
  SPIRVariable *var;
  size_t sVar4;
  size_t __n;
  uint *__dest;
  
  pSVar3 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if ((this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>.
      buffer_size != 0) {
    __dest = (this->super_CompilerGLSL).super_Compiler.global_variables.
             super_VectorView<unsigned_int>.ptr;
    do {
      uVar1 = *__dest;
      var = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar1);
      if ((var->storage | StorageClassUniform) == StorageClassPrivate) {
        bVar2 = CompilerGLSL::variable_is_lut(&this->super_CompilerGLSL,var);
        if (!bVar2) {
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                    (&pSVar3->local_variables,
                     (pSVar3->local_variables).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1)
          ;
          sVar4 = (pSVar3->local_variables).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
          (pSVar3->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          ptr[sVar4].id = uVar1;
          (pSVar3->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          buffer_size = sVar4 + 1;
        }
        sVar4 = (this->super_CompilerGLSL).super_Compiler.global_variables.
                super_VectorView<unsigned_int>.buffer_size;
        __n = (long)(this->super_CompilerGLSL).super_Compiler.global_variables.
                    super_VectorView<unsigned_int>.ptr + (sVar4 * 4 - (long)(__dest + 1));
        if (__n != 0) {
          memmove(__dest,__dest + 1,__n);
          sVar4 = (this->super_CompilerGLSL).super_Compiler.global_variables.
                  super_VectorView<unsigned_int>.buffer_size;
        }
        sVar4 = sVar4 - 1;
        (this->super_CompilerGLSL).super_Compiler.global_variables.super_VectorView<unsigned_int>.
        buffer_size = sVar4;
      }
      else {
        __dest = __dest + 1;
        sVar4 = (this->super_CompilerGLSL).super_Compiler.global_variables.
                super_VectorView<unsigned_int>.buffer_size;
      }
    } while (__dest != (this->super_CompilerGLSL).super_Compiler.global_variables.
                       super_VectorView<unsigned_int>.ptr + sVar4);
  }
  return;
}

Assistant:

void CompilerMSL::localize_global_variables()
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto iter = global_variables.begin();
	while (iter != global_variables.end())
	{
		uint32_t v_id = *iter;
		auto &var = get<SPIRVariable>(v_id);
		if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup)
		{
			if (!variable_is_lut(var))
				entry_func.add_local_variable(v_id);
			iter = global_variables.erase(iter);
		}
		else
			iter++;
	}
}